

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_sonarqube.hpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::writeAssertions
          (SonarQubeReporter *this,SectionNode *sectionNode,bool okToFail)

{
  bool bVar1;
  byte in_DL;
  long in_RSI;
  __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
  *in_RDI;
  AssertionStats *assertion;
  const_iterator __end2;
  const_iterator __begin2;
  Assertions *__range2;
  undefined1 in_stack_00000207;
  AssertionStats *in_stack_00000208;
  SonarQubeReporter *in_stack_00000210;
  vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
  local_28;
  long local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = in_RSI + 0xa0;
  local_28._M_current =
       (AssertionStats *)
       clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::begin
                 (in_stack_ffffffffffffffb8);
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::end
            (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
    ::operator*(&local_28);
    writeAssertion(in_stack_00000210,in_stack_00000208,(bool)in_stack_00000207);
    __gnu_cxx::
    __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void writeAssertions(SectionNode const& sectionNode, bool okToFail) {
            for(auto const& assertion : sectionNode.assertions)
                writeAssertion( assertion, okToFail);
        }